

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O2

void secp256k1_scalar_mul_shift_var
               (secp256k1_scalar *r,secp256k1_scalar *a,secp256k1_scalar *b,uint shift)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  int vflag;
  uint64_t l [8];
  
  uVar41 = a->d[0];
  uVar43 = a->d[1];
  uVar1 = a->d[2];
  uVar2 = b->d[0];
  uVar3 = b->d[1];
  uVar44 = b->d[2];
  uVar4 = b->d[3];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar41;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar2;
  uVar45 = SUB168(auVar5 * auVar21,8);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uVar45;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar41;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar3;
  auVar6 = auVar6 * auVar22;
  uVar52 = SUB168(auVar6 + auVar38,8);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar43;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar2;
  uVar46 = SUB168(auVar7 * auVar23,8);
  uVar40 = (ulong)CARRY8(SUB168(auVar6 + auVar38,0),SUB168(auVar7 * auVar23,0));
  uVar42 = uVar52 + uVar46;
  uVar53 = uVar42 + uVar40;
  uVar55 = (ulong)CARRY8(auVar6._8_8_,(ulong)CARRY8(uVar45,auVar6._0_8_)) +
           (ulong)(CARRY8(uVar52,uVar46) || CARRY8(uVar42,uVar40));
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar41;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar44;
  uVar47 = SUB168(auVar8 * auVar24,8);
  uVar40 = SUB168(auVar8 * auVar24,0);
  uVar54 = uVar53 + uVar40;
  uVar40 = (ulong)CARRY8(uVar53,uVar40);
  uVar46 = uVar55 + uVar47;
  uVar56 = uVar46 + uVar40;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar43;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar3;
  uVar48 = SUB168(auVar9 * auVar25,8);
  uVar45 = SUB168(auVar9 * auVar25,0);
  uVar42 = (ulong)CARRY8(uVar54,uVar45);
  uVar52 = uVar56 + uVar48;
  uVar57 = uVar52 + uVar42;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar1;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar2;
  uVar49 = SUB168(auVar10 * auVar26,8);
  uVar45 = (ulong)CARRY8(uVar54 + uVar45,SUB168(auVar10 * auVar26,0));
  uVar53 = uVar57 + uVar49;
  uVar54 = uVar53 + uVar45;
  uVar56 = (ulong)(CARRY8(uVar55,uVar47) || CARRY8(uVar46,uVar40)) +
           (ulong)(CARRY8(uVar56,uVar48) || CARRY8(uVar52,uVar42)) +
           (ulong)(CARRY8(uVar57,uVar49) || CARRY8(uVar53,uVar45));
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar41;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar4;
  uVar48 = SUB168(auVar11 * auVar27,8);
  uVar41 = SUB168(auVar11 * auVar27,0);
  uVar45 = uVar54 + uVar41;
  uVar40 = (ulong)CARRY8(uVar54,uVar41);
  uVar46 = uVar56 + uVar48;
  uVar57 = uVar46 + uVar40;
  uVar41 = a->d[3];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar43;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar44;
  uVar49 = SUB168(auVar12 * auVar28,8);
  uVar42 = SUB168(auVar12 * auVar28,0);
  uVar58 = uVar45 + uVar42;
  uVar42 = (ulong)CARRY8(uVar45,uVar42);
  uVar52 = uVar57 + uVar49;
  uVar50 = uVar52 + uVar42;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar1;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar3;
  uVar54 = SUB168(auVar13 * auVar29,8);
  uVar47 = SUB168(auVar13 * auVar29,0);
  uVar45 = (ulong)CARRY8(uVar58,uVar47);
  uVar53 = uVar50 + uVar54;
  uVar51 = uVar53 + uVar45;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar41;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar2;
  uVar55 = SUB168(auVar14 * auVar30,8);
  uVar2 = (ulong)CARRY8(uVar58 + uVar47,SUB168(auVar14 * auVar30,0));
  uVar47 = uVar51 + uVar55;
  uVar58 = uVar47 + uVar2;
  uVar48 = (ulong)(CARRY8(uVar56,uVar48) || CARRY8(uVar46,uVar40)) +
           (ulong)(CARRY8(uVar57,uVar49) || CARRY8(uVar52,uVar42)) +
           (ulong)(CARRY8(uVar50,uVar54) || CARRY8(uVar53,uVar45)) +
           (ulong)(CARRY8(uVar51,uVar55) || CARRY8(uVar47,uVar2));
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar43;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar4;
  uVar46 = SUB168(auVar15 * auVar31,8);
  uVar43 = SUB168(auVar15 * auVar31,0);
  uVar47 = uVar58 + uVar43;
  uVar43 = (ulong)CARRY8(uVar58,uVar43);
  uVar40 = uVar48 + uVar46;
  uVar49 = uVar40 + uVar43;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar1;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar44;
  uVar52 = SUB168(auVar16 * auVar32,8);
  uVar45 = SUB168(auVar16 * auVar32,0);
  uVar2 = (ulong)CARRY8(uVar47,uVar45);
  uVar42 = uVar49 + uVar52;
  uVar54 = uVar42 + uVar2;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar41;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar3;
  uVar53 = SUB168(auVar17 * auVar33,8);
  uVar3 = (ulong)CARRY8(uVar47 + uVar45,SUB168(auVar17 * auVar33,0));
  uVar45 = uVar54 + uVar53;
  uVar47 = uVar45 + uVar3;
  uVar46 = (ulong)(CARRY8(uVar48,uVar46) || CARRY8(uVar40,uVar43)) +
           (ulong)(CARRY8(uVar49,uVar52) || CARRY8(uVar42,uVar2)) +
           (ulong)(CARRY8(uVar54,uVar53) || CARRY8(uVar45,uVar3));
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar1;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar4;
  uVar40 = SUB168(auVar18 * auVar34,8);
  uVar43 = SUB168(auVar18 * auVar34,0);
  uVar45 = uVar47 + uVar43;
  uVar43 = (ulong)CARRY8(uVar47,uVar43);
  uVar2 = uVar46 + uVar40;
  uVar52 = uVar2 + uVar43;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar41;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar44;
  uVar42 = SUB168(auVar19 * auVar35,8);
  uVar44 = SUB168(auVar19 * auVar35,0);
  uVar1 = (ulong)CARRY8(uVar45,uVar44);
  uVar3 = uVar52 + uVar42;
  auVar37._8_8_ =
       (ulong)(CARRY8(uVar46,uVar40) || CARRY8(uVar2,uVar43)) +
       (ulong)(CARRY8(uVar52,uVar42) || CARRY8(uVar3,uVar1));
  auVar37._0_8_ = uVar3 + uVar1;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar41;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar4;
  auVar37 = auVar20 * auVar36 + auVar37;
  l[0] = auVar37._0_8_;
  l[1] = auVar37._8_8_;
  uVar41 = CONCAT44(0,(uint)((long)(uVar45 + uVar44) >> 0x3f) >> 8 & 1);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uVar41;
  *(undefined1 (*) [16])r->d = auVar37 + auVar39;
  r->d[2] = (ulong)CARRY8(l[1],(ulong)CARRY8(uVar41,l[0]));
  r->d[3] = 0;
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_scalar_mul_shift_var(secp256k1_scalar *r, const secp256k1_scalar *a, const secp256k1_scalar *b, unsigned int shift) {
    uint64_t l[8];
    unsigned int shiftlimbs;
    unsigned int shiftlow;
    unsigned int shifthigh;
    SECP256K1_SCALAR_VERIFY(a);
    SECP256K1_SCALAR_VERIFY(b);
    VERIFY_CHECK(shift >= 256);

    secp256k1_scalar_mul_512(l, a, b);
    shiftlimbs = shift >> 6;
    shiftlow = shift & 0x3F;
    shifthigh = 64 - shiftlow;
    r->d[0] = shift < 512 ? (l[0 + shiftlimbs] >> shiftlow | (shift < 448 && shiftlow ? (l[1 + shiftlimbs] << shifthigh) : 0)) : 0;
    r->d[1] = shift < 448 ? (l[1 + shiftlimbs] >> shiftlow | (shift < 384 && shiftlow ? (l[2 + shiftlimbs] << shifthigh) : 0)) : 0;
    r->d[2] = shift < 384 ? (l[2 + shiftlimbs] >> shiftlow | (shift < 320 && shiftlow ? (l[3 + shiftlimbs] << shifthigh) : 0)) : 0;
    r->d[3] = shift < 320 ? (l[3 + shiftlimbs] >> shiftlow) : 0;
    secp256k1_scalar_cadd_bit(r, 0, (l[(shift - 1) >> 6] >> ((shift - 1) & 0x3f)) & 1);

    SECP256K1_SCALAR_VERIFY(r);
}